

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_blob_open(sqlite3 *db,char *zDb,char *zTable,char *zColumn,sqlite_int64 iRow,int wrFlag,
                     sqlite3_blob **ppBlob)

{
  u8 uVar1;
  short sVar2;
  Schema *pSVar3;
  char *p;
  int iVar4;
  int iVar5;
  Incrblob *p_00;
  Parse *pParse;
  Table *pTVar6;
  Index *pIVar7;
  Vdbe *p_01;
  FKey *pFVar8;
  VdbeOp *pVVar9;
  sqlite3 *psVar10;
  ulong uVar11;
  Schema **ppSVar12;
  undefined8 uVar13;
  char *pcVar14;
  Column *pCVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  int p1;
  char *zErr;
  char *local_98;
  Parse *local_90;
  Table *local_88;
  int local_80;
  uint local_7c;
  sqlite3 *local_78;
  Incrblob *local_70;
  char *local_68;
  char *local_60;
  VdbeOp *local_58;
  char **local_50;
  undefined8 local_48;
  sqlite_int64 local_40;
  char *local_38;
  
  local_98 = (char *)0x0;
  *ppBlob = (sqlite3_blob *)0x0;
  local_68 = zTable;
  local_60 = zColumn;
  local_40 = iRow;
  local_38 = zDb;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  p_00 = (Incrblob *)sqlite3DbMallocZero(db,0x38);
  if (p_00 == (Incrblob *)0x0) {
LAB_0011c24c:
    pParse = (Parse *)0x0;
LAB_0011c24e:
    uVar18 = 0;
    if (db->mallocFailed == '\0') {
      *ppBlob = (sqlite3_blob *)p_00;
      pcVar14 = "%s";
      if (local_98 == (char *)0x0) {
        pcVar14 = (char *)0x0;
      }
      uVar18 = 0;
      goto LAB_0011c2f2;
    }
LAB_0011c2b8:
    if (p_00 != (Incrblob *)0x0) goto LAB_0011c2c0;
  }
  else {
    pParse = (Parse *)sqlite3DbMallocRawNN(db,0x250);
    uVar13 = 0;
    if (pParse == (Parse *)0x0) goto LAB_0011c24c;
    local_50 = &pParse->zErrMsg;
    local_7c = 0;
    local_90 = pParse;
    local_80 = wrFlag;
    local_78 = db;
    local_70 = p_00;
    do {
      local_48 = uVar13;
      memset(local_50,0,0x248);
      pParse->db = db;
      if (local_98 != (char *)0x0) {
        sqlite3DbFreeNN(db,local_98);
      }
      local_98 = (char *)0x0;
      if (db->skipBtreeMutex == '\0') {
        btreeEnterAll(db);
      }
      pTVar6 = sqlite3LocateTable(pParse,0,local_68,local_38);
      if (pTVar6 == (Table *)0x0) {
LAB_0011c390:
        pcVar14 = pParse->zErrMsg;
        if (pcVar14 != (char *)0x0) {
          pParse->zErrMsg = (char *)0x0;
          local_98 = pcVar14;
        }
        uVar18 = 1;
        if (db->skipBtreeMutex == '\0') {
          btreeLeaveAll(db);
        }
        goto LAB_0011c2c0;
      }
      if (pTVar6->nModuleArg != 0) {
        pcVar14 = "cannot open virtual table: %s";
LAB_0011c381:
        sqlite3ErrorMsg(pParse,pcVar14,local_68);
        goto LAB_0011c390;
      }
      if ((pTVar6->tabFlags & 0x20) != 0) {
        pcVar14 = "cannot open table without rowid: %s";
        goto LAB_0011c381;
      }
      if (pTVar6->pSelect != (Select *)0x0) {
        pcVar14 = "cannot open view: %s";
        goto LAB_0011c381;
      }
      p_00->pTab = pTVar6;
      if (pTVar6->pSchema == (Schema *)0x0) {
        uVar16 = 0xfff0bdc0;
      }
      else {
        uVar18 = db->nDb;
        if ((int)uVar18 < 1) {
          uVar16 = 0;
        }
        else {
          ppSVar12 = &db->aDb->pSchema;
          uVar11 = 0;
          do {
            uVar16 = uVar11;
            if (*ppSVar12 == pTVar6->pSchema) break;
            uVar11 = uVar11 + 1;
            ppSVar12 = ppSVar12 + 4;
            uVar16 = (ulong)uVar18;
          } while (uVar18 != uVar11);
        }
      }
      p_00->zDb = db->aDb[(int)uVar16].zDbSName;
      sVar2 = pTVar6->nCol;
      local_88 = pTVar6;
      if (sVar2 < 1) {
        uVar16 = 0;
      }
      else {
        pCVar15 = pTVar6->aCol;
        uVar16 = 0;
        while (iVar4 = sqlite3StrICmp(pCVar15->zName,local_60), iVar4 != 0) {
          uVar16 = uVar16 + 1;
          pCVar15 = pCVar15 + 1;
          if ((uint)(int)sVar2 == uVar16) goto LAB_0011c274;
        }
      }
      p_00 = local_70;
      db = local_78;
      uVar18 = (uint)uVar16;
      if (uVar18 == (int)sVar2) {
LAB_0011c274:
        db = local_78;
        local_98 = sqlite3MPrintf(local_78,"no such column: \"%s\"",local_60);
        uVar1 = db->skipBtreeMutex;
        p_00 = local_70;
joined_r0x0011c3e3:
        if (uVar1 == '\0') {
          btreeLeaveAll(db);
        }
        uVar18 = 1;
        pParse = local_90;
        goto LAB_0011c2b8;
      }
      if (local_80 != 0) {
        if ((local_78->flags & 0x4000) == 0) {
          pcVar14 = (char *)0x0;
        }
        else {
          pcVar14 = (char *)0x0;
          for (pFVar8 = local_88->pFKey; pFVar8 != (FKey *)0x0; pFVar8 = pFVar8->pNextFrom) {
            if (0 < (long)pFVar8->nCol) {
              lVar17 = 0;
              do {
                if (*(uint *)((long)&pFVar8->aCol[0].iFrom + lVar17) == uVar18) {
                  pcVar14 = "foreign key";
                }
                lVar17 = lVar17 + 0x10;
              } while ((long)pFVar8->nCol * 0x10 != lVar17);
            }
          }
        }
        for (pIVar7 = local_88->pIndex; pIVar7 != (Index *)0x0; pIVar7 = pIVar7->pNext) {
          if ((ulong)pIVar7->nKeyCol != 0) {
            uVar11 = 0;
            do {
              if (uVar18 == (int)pIVar7->aiColumn[uVar11]) {
                pcVar14 = "indexed";
              }
              if ((int)pIVar7->aiColumn[uVar11] == 0xfffffffe) {
                pcVar14 = "indexed";
              }
              uVar11 = uVar11 + 1;
            } while (pIVar7->nKeyCol != uVar11);
          }
        }
        if (pcVar14 != (char *)0x0) {
          local_98 = sqlite3MPrintf(local_78,"cannot open %s column for writing");
          uVar1 = db->skipBtreeMutex;
          goto joined_r0x0011c3e3;
        }
      }
      p_01 = sqlite3VdbeCreate(local_90);
      p_00->pStmt = (sqlite3_stmt *)p_01;
      if (p_01 != (Vdbe *)0x0) {
        pSVar3 = local_88->pSchema;
        if (pSVar3 == (Schema *)0x0) {
          uVar11 = 0xfff0bdc0;
        }
        else {
          uVar18 = db->nDb;
          if ((int)uVar18 < 1) {
            uVar11 = 0;
          }
          else {
            ppSVar12 = &db->aDb->pSchema;
            uVar11 = 0;
            do {
              if (*ppSVar12 == pSVar3) goto LAB_0011c093;
              uVar11 = uVar11 + 1;
              ppSVar12 = ppSVar12 + 4;
            } while (uVar18 != uVar11);
            uVar11 = (ulong)uVar18;
          }
        }
LAB_0011c093:
        iVar4 = pSVar3->iGeneration;
        p1 = (int)uVar11;
        iVar5 = sqlite3VdbeAddOp3(p_01,2,p1,(uint)(wrFlag != 0),pSVar3->schema_cookie);
        db = local_78;
        psVar10 = p_01->db;
        if (psVar10->mallocFailed == '\0') {
          psVar10 = (sqlite3 *)p_01->aOp;
          *(undefined1 *)((long)psVar10->aLimit + (long)iVar5 * 0x18 + -0x6f) = 0xfd;
          psVar10->aLimit[(long)iVar5 * 6 + -0x18] = iVar4;
        }
        if (0 < (long)p_01->nOp) {
          psVar10 = (sqlite3 *)p_01->aOp;
          *(undefined2 *)((long)psVar10 + ((long)p_01->nOp + -1) * 0x18 + 2) = 1;
        }
        pVVar9 = sqlite3VdbeAddOpList(p_01,6,sqlite3_blob_open::openBlob,(int)psVar10);
        uVar18 = 1 << ((byte)uVar11 & 0x1f);
        p_01->btreeMask = p_01->btreeMask | uVar18;
        if ((p1 != 1) && ((p_01->db->aDb[p1].pBt)->sharable != '\0')) {
          p_01->lockMask = p_01->lockMask | uVar18;
        }
        if (db->mallocFailed == '\0') {
          pVVar9->p1 = p1;
          pVVar9->p2 = local_88->tnum;
          pVVar9->p3 = (uint)(wrFlag != 0);
          local_58 = pVVar9;
          sqlite3VdbeChangeP4(p_01,1,local_88->zName,0);
          if (db->mallocFailed == '\0') {
            if (local_80 != 0) {
              local_58[1].opcode = 'i';
            }
            local_58[1].p2 = local_88->tnum;
            local_58[1].p3 = p1;
            local_58[1].p4type = -3;
            local_58[1].p4.i = local_88->nCol + 1;
            local_58[3].p2 = (int)local_88->nCol;
            local_90->nVar = 0;
            local_90->nTab = 1;
            local_90->nMem = 1;
            sqlite3VdbeMakeReady(p_01,local_90);
          }
        }
      }
      p_00 = local_70;
      local_70->iCol = (u16)uVar16;
      local_70->db = db;
      if (db->skipBtreeMutex == '\0') {
        btreeLeaveAll(db);
      }
      pParse = local_90;
      uVar18 = (uint)local_48;
      if ((db->mallocFailed != '\0') ||
         (uVar18 = blobSeekToRow(p_00,local_40,&local_98), 0x30 < local_7c)) break;
      local_7c = local_7c + 1;
      uVar13 = 0x11;
    } while (uVar18 == 0x11);
    if (uVar18 == 0) goto LAB_0011c24e;
LAB_0011c2c0:
    if ((Vdbe *)p_00->pStmt != (Vdbe *)0x0) {
      sqlite3VdbeFinalize((Vdbe *)p_00->pStmt);
    }
    sqlite3DbFreeNN(db,p_00);
  }
  pcVar14 = "%s";
  if (local_98 == (char *)0x0) {
    pcVar14 = (char *)0x0;
  }
LAB_0011c2f2:
  p = local_98;
  sqlite3ErrorWithMsg(db,uVar18,pcVar14,local_98);
  if (p != (char *)0x0) {
    sqlite3DbFreeNN(db,p);
  }
  sqlite3ParserReset(pParse);
  if (pParse != (Parse *)0x0) {
    sqlite3DbFreeNN(db,pParse);
  }
  if ((uVar18 == 0xc0a) || (db->mallocFailed != '\0')) {
    apiOomError(db);
    uVar18 = 7;
  }
  else {
    uVar18 = uVar18 & db->errMask;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return uVar18;
}

Assistant:

SQLITE_API int sqlite3_blob_open(
  sqlite3* db,            /* The database connection */
  const char *zDb,        /* The attached database containing the blob */
  const char *zTable,     /* The table containing the blob */
  const char *zColumn,    /* The column containing the blob */
  sqlite_int64 iRow,      /* The row containing the glob */
  int wrFlag,             /* True -> read/write access, false -> read-only */
  sqlite3_blob **ppBlob   /* Handle for accessing the blob returned here */
){
  int nAttempt = 0;
  int iCol;               /* Index of zColumn in row-record */
  int rc = SQLITE_OK;
  char *zErr = 0;
  Table *pTab;
  Parse *pParse = 0;
  Incrblob *pBlob = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppBlob==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  *ppBlob = 0;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  wrFlag = !!wrFlag;                /* wrFlag = (wrFlag ? 1 : 0); */

  sqlite3_mutex_enter(db->mutex);

  pBlob = (Incrblob *)sqlite3DbMallocZero(db, sizeof(Incrblob));
  if( !pBlob ) goto blob_open_out;
  pParse = sqlite3StackAllocRaw(db, sizeof(*pParse));
  if( !pParse ) goto blob_open_out;

  do {
    memset(pParse, 0, sizeof(Parse));
    pParse->db = db;
    sqlite3DbFree(db, zErr);
    zErr = 0;

    sqlite3BtreeEnterAll(db);
    pTab = sqlite3LocateTable(pParse, 0, zTable, zDb);
    if( pTab && IsVirtual(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open virtual table: %s", zTable);
    }
    if( pTab && !HasRowid(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open table without rowid: %s", zTable);
    }
#ifndef SQLITE_OMIT_VIEW
    if( pTab && pTab->pSelect ){
      pTab = 0;
      sqlite3ErrorMsg(pParse, "cannot open view: %s", zTable);
    }
#endif
    if( !pTab ){
      if( pParse->zErrMsg ){
        sqlite3DbFree(db, zErr);
        zErr = pParse->zErrMsg;
        pParse->zErrMsg = 0;
      }
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }
    pBlob->pTab = pTab;
    pBlob->zDb = db->aDb[sqlite3SchemaToIndex(db, pTab->pSchema)].zDbSName;

    /* Now search pTab for the exact column. */
    for(iCol=0; iCol<pTab->nCol; iCol++) {
      if( sqlite3StrICmp(pTab->aCol[iCol].zName, zColumn)==0 ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      sqlite3DbFree(db, zErr);
      zErr = sqlite3MPrintf(db, "no such column: \"%s\"", zColumn);
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* If the value is being opened for writing, check that the
    ** column is not indexed, and that it is not part of a foreign key. 
    */
    if( wrFlag ){
      const char *zFault = 0;
      Index *pIdx;
#ifndef SQLITE_OMIT_FOREIGN_KEY
      if( db->flags&SQLITE_ForeignKeys ){
        /* Check that the column is not part of an FK child key definition. It
        ** is not necessary to check if it is part of a parent key, as parent
        ** key columns must be indexed. The check below will pick up this 
        ** case.  */
        FKey *pFKey;
        for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
          int j;
          for(j=0; j<pFKey->nCol; j++){
            if( pFKey->aCol[j].iFrom==iCol ){
              zFault = "foreign key";
            }
          }
        }
      }
#endif
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        int j;
        for(j=0; j<pIdx->nKeyCol; j++){
          /* FIXME: Be smarter about indexes that use expressions */
          if( pIdx->aiColumn[j]==iCol || pIdx->aiColumn[j]==XN_EXPR ){
            zFault = "indexed";
          }
        }
      }
      if( zFault ){
        sqlite3DbFree(db, zErr);
        zErr = sqlite3MPrintf(db, "cannot open %s column for writing", zFault);
        rc = SQLITE_ERROR;
        sqlite3BtreeLeaveAll(db);
        goto blob_open_out;
      }
    }

    pBlob->pStmt = (sqlite3_stmt *)sqlite3VdbeCreate(pParse);
    assert( pBlob->pStmt || db->mallocFailed );
    if( pBlob->pStmt ){
      
      /* This VDBE program seeks a btree cursor to the identified 
      ** db/table/row entry. The reason for using a vdbe program instead
      ** of writing code to use the b-tree layer directly is that the
      ** vdbe program will take advantage of the various transaction,
      ** locking and error handling infrastructure built into the vdbe.
      **
      ** After seeking the cursor, the vdbe executes an OP_ResultRow.
      ** Code external to the Vdbe then "borrows" the b-tree cursor and
      ** uses it to implement the blob_read(), blob_write() and 
      ** blob_bytes() functions.
      **
      ** The sqlite3_blob_close() function finalizes the vdbe program,
      ** which closes the b-tree cursor and (possibly) commits the 
      ** transaction.
      */
      static const int iLn = VDBE_OFFSET_LINENO(2);
      static const VdbeOpList openBlob[] = {
        {OP_TableLock,      0, 0, 0},  /* 0: Acquire a read or write lock */
        {OP_OpenRead,       0, 0, 0},  /* 1: Open a cursor */
        /* blobSeekToRow() will initialize r[1] to the desired rowid */
        {OP_NotExists,      0, 5, 1},  /* 2: Seek the cursor to rowid=r[1] */
        {OP_Column,         0, 0, 1},  /* 3  */
        {OP_ResultRow,      1, 0, 0},  /* 4  */
        {OP_Halt,           0, 0, 0},  /* 5  */
      };
      Vdbe *v = (Vdbe *)pBlob->pStmt;
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
      VdbeOp *aOp;

      sqlite3VdbeAddOp4Int(v, OP_Transaction, iDb, wrFlag, 
                           pTab->pSchema->schema_cookie,
                           pTab->pSchema->iGeneration);
      sqlite3VdbeChangeP5(v, 1);     
      aOp = sqlite3VdbeAddOpList(v, ArraySize(openBlob), openBlob, iLn);

      /* Make sure a mutex is held on the table to be accessed */
      sqlite3VdbeUsesBtree(v, iDb); 

      if( db->mallocFailed==0 ){
        assert( aOp!=0 );
        /* Configure the OP_TableLock instruction */
#ifdef SQLITE_OMIT_SHARED_CACHE
        aOp[0].opcode = OP_Noop;
#else
        aOp[0].p1 = iDb;
        aOp[0].p2 = pTab->tnum;
        aOp[0].p3 = wrFlag;
        sqlite3VdbeChangeP4(v, 1, pTab->zName, P4_TRANSIENT);
      }
      if( db->mallocFailed==0 ){
#endif

        /* Remove either the OP_OpenWrite or OpenRead. Set the P2 
        ** parameter of the other to pTab->tnum.  */
        if( wrFlag ) aOp[1].opcode = OP_OpenWrite;
        aOp[1].p2 = pTab->tnum;
        aOp[1].p3 = iDb;   

        /* Configure the number of columns. Configure the cursor to
        ** think that the table has one more column than it really
        ** does. An OP_Column to retrieve this imaginary column will
        ** always return an SQL NULL. This is useful because it means
        ** we can invoke OP_Column to fill in the vdbe cursors type 
        ** and offset cache without causing any IO.
        */
        aOp[1].p4type = P4_INT32;
        aOp[1].p4.i = pTab->nCol+1;
        aOp[3].p2 = pTab->nCol;

        pParse->nVar = 0;
        pParse->nMem = 1;
        pParse->nTab = 1;
        sqlite3VdbeMakeReady(v, pParse);
      }
    }
   
    pBlob->iCol = iCol;
    pBlob->db = db;
    sqlite3BtreeLeaveAll(db);
    if( db->mallocFailed ){
      goto blob_open_out;
    }
    rc = blobSeekToRow(pBlob, iRow, &zErr);
  } while( (++nAttempt)<SQLITE_MAX_SCHEMA_RETRY && rc==SQLITE_SCHEMA );

blob_open_out:
  if( rc==SQLITE_OK && db->mallocFailed==0 ){
    *ppBlob = (sqlite3_blob *)pBlob;
  }else{
    if( pBlob && pBlob->pStmt ) sqlite3VdbeFinalize((Vdbe *)pBlob->pStmt);
    sqlite3DbFree(db, pBlob);
  }
  sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : 0), zErr);
  sqlite3DbFree(db, zErr);
  sqlite3ParserReset(pParse);
  sqlite3StackFree(db, pParse);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}